

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

void __thiscall cimg_library::CImgDisplay::_paint(CImgDisplay *this,bool wait_expose)

{
  if ((this->_is_closed == false) && (this->_image != (XImage *)0x0)) {
    if (cimg::X11_attr()::val == '\0') {
      _paint();
    }
    if (wait_expose) {
      _paint::event.type = 0xc;
      _paint::event.xany.serial = 0;
      _paint::event.xany.send_event = 1;
      _paint::event.xany.display = cimg::X11_attr::val.display;
      _paint::event.xany.window = this->_window;
      _paint::event.xkey.root = 0;
      _paint::event._48_4_ = this->_width;
      _paint::event._52_4_ = this->_height;
      _paint::event.xexpose.count = 0;
      XSendEvent(cimg::X11_attr::val.display,_paint::event.xany.window,0,0,&_paint::event);
      return;
    }
    XPutImage(cimg::X11_attr::val.display,this->_window,
              *(undefined8 *)
               (*(long *)(cimg::X11_attr::val.display + 0xe8) + 0x48 +
               (long)*(int *)(cimg::X11_attr::val.display + 0xe0) * 0x80),this->_image,0,0,0,0,
              this->_width,this->_height);
  }
  return;
}

Assistant:

void _paint(const bool wait_expose=true) {
      if (_is_closed || !_image) return;
      Display *const dpy = cimg::X11_attr().display;
      if (wait_expose) { // Send an expose event sticked to display window to force repaint.
        static XEvent event;
        event.xexpose.type = Expose;
        event.xexpose.serial = 0;
        event.xexpose.send_event = True;
        event.xexpose.display = dpy;
        event.xexpose.window = _window;
        event.xexpose.x = 0;
        event.xexpose.y = 0;
        event.xexpose.width = width();
        event.xexpose.height = height();
        event.xexpose.count = 0;
        XSendEvent(dpy,_window,False,0,&event);
      } else { // Repaint directly (may be called from the expose event).
        GC gc = DefaultGC(dpy,DefaultScreen(dpy));
#ifdef cimg_use_xshm
        if (_shminfo) {
          const int completion_type = XShmGetEventBase(dpy) + ShmCompletion;
          XEvent event;
          XShmPutImage(dpy,_window,gc,_image,0,0,0,0,_width,_height,True);
          do { XNextEvent(dpy,&event); } while (event.type!=completion_type);  // Wait for the image drawing to be completed.
        } else XPutImage(dpy,_window,gc,_image,0,0,0,0,_width,_height);
#else
        XPutImage(dpy,_window,gc,_image,0,0,0,0,_width,_height);
#endif
      }
    }